

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void nlohmann::detail::
     from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int,DRAMAddr,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,DRAMAddr>>,void>
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *j,unordered_map<int,_DRAMAddr,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DRAMAddr>_>_>
                   *m)

{
  primitive_iterator_t *this;
  bool bVar1;
  reference this_00;
  const_reference pvVar2;
  type_error *ptVar3;
  char *pcVar4;
  size_t sVar5;
  undefined1 local_b0 [8];
  const_iterator __begin0;
  int ret;
  undefined1 local_70 [8];
  const_iterator __end0;
  undefined1 local_40 [16];
  
  if (j->m_type != array) {
    ptVar3 = (type_error *)__cxa_allocate_exception(0x20);
    pcVar4 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::type_name(j);
    local_70 = (undefined1  [8])&__end0.m_it;
    sVar5 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pcVar4,pcVar4 + sVar5);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   "type must be array, but is ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    type_error::create(ptVar3,0x12e,(string *)local_b0);
    __cxa_throw(ptVar3,&type_error::typeinfo,exception::~exception);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&m->_M_h);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cbegin((const_iterator *)local_b0,j);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cend((const_iterator *)local_70,j);
  bVar1 = iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator==((const_iterator *)local_b0,(const_iterator *)local_70);
  if (!bVar1) {
    this = &__begin0.m_it.primitive_iterator;
    do {
      this_00 = iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((const_iterator *)local_b0);
      if (this_00->m_type != array) {
        ptVar3 = (type_error *)__cxa_allocate_exception(0x20);
        pcVar4 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::type_name(this_00);
        __end0.m_it.primitive_iterator.m_it = (difference_type)local_40;
        sVar5 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&__end0.m_it.primitive_iterator,pcVar4,pcVar4 + sVar5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__begin0.m_it.primitive_iterator,"type must be array, but is ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__end0.m_it.primitive_iterator);
        type_error::create(ptVar3,0x12e,(string *)&__begin0.m_it.primitive_iterator);
        __cxa_throw(ptVar3,&type_error::typeinfo,exception::~exception);
      }
      pvVar2 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(this_00,0);
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
                (pvVar2,(int *)this);
      __end0.m_it.primitive_iterator.m_it._0_4_ = (undefined4)__begin0.m_it.primitive_iterator.m_it;
      pvVar2 = basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::at(this_00,1);
      DRAMAddr::DRAMAddr((DRAMAddr *)this);
      from_json(pvVar2,(DRAMAddr *)this);
      std::
      _Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<int,DRAMAddr>
                ((_Hashtable<int,std::pair<int_const,DRAMAddr>,std::allocator<std::pair<int_const,DRAMAddr>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)m,&__end0.m_it.primitive_iterator,this);
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((const_iterator *)local_b0);
      bVar1 = iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator==((const_iterator *)local_b0,
                           (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            *)local_70);
    } while (!bVar1);
  }
  return;
}

Assistant:

void from_json(const BasicJsonType& j, std::unordered_map<Key, Value, Hash, KeyEqual, Allocator>& m)
{
    if (JSON_HEDLEY_UNLIKELY(!j.is_array()))
    {
        JSON_THROW(type_error::create(302, "type must be array, but is " + std::string(j.type_name())));
    }
    m.clear();
    for (const auto& p : j)
    {
        if (JSON_HEDLEY_UNLIKELY(!p.is_array()))
        {
            JSON_THROW(type_error::create(302, "type must be array, but is " + std::string(p.type_name())));
        }
        m.emplace(p.at(0).template get<Key>(), p.at(1).template get<Value>());
    }
}